

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O2

void UnitTest::CheckEqual<int,FIX::EncryptMethod>
               (TestResults *results,int *expected,EncryptMethod *actual,TestDetails *details)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *failure;
  MemoryOutStream stream;
  MemoryOutStream MStack_1c8;
  
  iVar1 = *expected;
  iVar2 = FIX::IntField::getValue(&actual->super_IntField);
  if (iVar1 != iVar2) {
    MemoryOutStream::MemoryOutStream(&MStack_1c8);
    poVar3 = std::operator<<((ostream *)&MStack_1c8,"Expected ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*expected);
    poVar3 = std::operator<<(poVar3," but was ");
    std::operator<<(poVar3,(string *)&(actual->super_IntField).super_FieldBase.m_string);
    failure = MemoryOutStream::GetText(&MStack_1c8);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream(&MStack_1c8);
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}